

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawListSharedData::SetCircleSegmentMaxError(ImDrawListSharedData *this,float max_error)

{
  int iVar1;
  int i;
  long lVar2;
  float fVar3;
  
  if ((this->CircleSegmentMaxError == max_error) &&
     (!NAN(this->CircleSegmentMaxError) && !NAN(max_error))) {
    return;
  }
  this->CircleSegmentMaxError = max_error;
  lVar2 = 0;
  do {
    fVar3 = (float)(int)lVar2 + 1.0;
    fVar3 = acosf((fVar3 - this->CircleSegmentMaxError) / fVar3);
    iVar1 = (int)(6.2831855 / fVar3);
    if (0x1ff < iVar1) {
      iVar1 = 0x200;
    }
    if (iVar1 < 0xd) {
      iVar1 = 0xc;
    }
    if (0xfe < iVar1) {
      iVar1 = 0xff;
    }
    this->CircleSegmentCounts[lVar2] = (ImU8)iVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x40);
  return;
}

Assistant:

void ImDrawListSharedData::SetCircleSegmentMaxError(float max_error)
{
    if (CircleSegmentMaxError == max_error)
        return;
    CircleSegmentMaxError = max_error;
    for (int i = 0; i < IM_ARRAYSIZE(CircleSegmentCounts); i++)
    {
        const float radius = i + 1.0f;
        const int segment_count = IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, CircleSegmentMaxError);
        CircleSegmentCounts[i] = (ImU8)ImMin(segment_count, 255);
    }
}